

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O1

void CreateBackwardReferencesNH41
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command_conflict *commands,
               size_t *num_commands,size_t *num_literals,
               BackwardReferenceFromDecoder *backward_references,size_t *back_refs_position,
               size_t back_refs_size)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  size_t *psVar14;
  int *piVar15;
  ulong uVar16;
  ulong uVar17;
  BrotliTransforms *pBVar18;
  uint8_t *puVar19;
  ulong uVar20;
  byte bVar21;
  ushort uVar22;
  ulong uVar23;
  char *pcVar24;
  int iVar25;
  int iVar26;
  ulong uVar27;
  size_t sVar28;
  size_t *psVar29;
  size_t sVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  ushort uVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  size_t *psVar41;
  ulong uVar42;
  ulong uVar43;
  long lVar44;
  ulong uVar45;
  long lVar46;
  int *piVar47;
  long lVar48;
  char cVar49;
  uint uVar50;
  long lVar51;
  uint uVar52;
  uint uVar53;
  int iVar54;
  size_t sVar55;
  ulong uVar56;
  size_t sVar57;
  ulong uVar58;
  ulong uVar59;
  bool bVar60;
  bool bVar61;
  ulong local_148;
  int *local_138;
  ulong local_130;
  ulong local_118;
  ulong local_108;
  ulong local_100;
  ulong local_e8;
  ulong local_d0;
  long local_c8;
  size_t *local_b0;
  ulong local_a8;
  
  bVar21 = literal_context_lut[8];
  lVar5 = *(long *)(literal_context_lut + 0x10);
  local_e8 = *(ulong *)dist_cache;
  uVar12 = (position - 3) + num_bytes;
  if (num_bytes < 4) {
    uVar12 = position;
  }
  lVar37 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar37 = 0x40;
  }
  iVar26 = *(int *)&(hasher->common).extra;
  *(int *)&(hasher->common).dict_num_matches = iVar26 + -1;
  *(int *)((long)&(hasher->common).dict_num_matches + 4) = iVar26 + 1;
  (hasher->common).params.type = iVar26 + -2;
  (hasher->common).params.bucket_bits = iVar26 + 2;
  (hasher->common).params.block_bits = iVar26 + -3;
  (hasher->common).params.hash_len = iVar26 + 3;
  uVar1 = position + num_bytes;
  if (position + 4 < uVar1) {
    uVar27 = (1L << (bVar21 & 0x3f)) - 0x10;
    local_a8 = lVar37 + position;
    lVar2 = position - 1;
    local_b0 = last_insert_len;
    sVar28 = position;
    do {
      uVar39 = uVar27;
      if (sVar28 < uVar27) {
        uVar39 = sVar28;
      }
      uVar43 = lVar5 + sVar28;
      if (uVar27 <= lVar5 + sVar28) {
        uVar43 = uVar27;
      }
      uVar38 = *(ulong *)(literal_context_lut + 0x50);
      uVar13 = sVar28 & ringbuffer_mask;
      iVar26 = *(int *)(ringbuffer + uVar13);
      lVar48 = *(long *)&params->dist;
      psVar29 = *(size_t **)backward_references;
      bVar60 = psVar29 < back_refs_position;
      if ((bVar60) && ((ulong)(long)(int)num_literals[(long)psVar29 * 2] < sVar28)) {
        psVar14 = num_literals + (long)psVar29 * 2 + 2;
        psVar41 = psVar29;
        do {
          psVar41 = (size_t *)((long)psVar41 + 1);
          psVar29 = back_refs_position;
          if (back_refs_position == psVar41) break;
          sVar8 = *psVar14;
          psVar14 = psVar14 + 2;
          psVar29 = psVar41;
        } while ((ulong)(long)(int)sVar8 < sVar28);
        *(size_t **)backward_references = psVar41;
        bVar60 = psVar41 < back_refs_position;
      }
      uVar32 = uVar1 - sVar28;
      piVar15 = (int *)(ringbuffer + uVar13);
      if ((bVar60) && (sVar28 == (long)(int)num_literals[(long)psVar29 * 2])) {
        uVar50 = (uint)num_literals[(long)psVar29 * 2 + 1];
        local_108 = (ulong)(int)uVar50;
        local_100 = 0x7e4;
        bVar61 = true;
        if (sVar28 - local_108 < sVar28) {
          if (*(uint *)((long)num_literals + (long)psVar29 * 0x10 + 0xc) < uVar50) {
            bVar60 = false;
            local_108 = 0;
            sVar55 = 0;
          }
          else {
            uVar16 = sVar28 - local_108 & ringbuffer_mask;
            if (7 < uVar32) {
              uVar35 = uVar32 & 0xfffffffffffffff8;
              local_138 = (int *)(ringbuffer + uVar35 + uVar13);
              lVar48 = 0;
              uVar13 = 0;
LAB_00119c47:
              if (*(ulong *)(piVar15 + uVar13 * 2) == *(ulong *)(ringbuffer + uVar13 * 8 + uVar16))
              goto code_r0x00119c59;
              uVar16 = *(ulong *)(ringbuffer + uVar13 * 8 + uVar16) ^
                       *(ulong *)(piVar15 + uVar13 * 2);
              uVar13 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                }
              }
              uVar13 = (uVar13 >> 3 & 0x1fffffff) - lVar48;
              goto LAB_00119caf;
            }
            uVar35 = 0;
            local_138 = piVar15;
LAB_0011a12e:
            uVar17 = uVar32 & 7;
            uVar13 = uVar35;
            if (uVar17 != 0) {
              uVar58 = uVar35 | uVar17;
              do {
                uVar13 = uVar35;
                if (ringbuffer[uVar35 + uVar16] != (uint8_t)*local_138) break;
                local_138 = (int *)((long)local_138 + 1);
                uVar35 = uVar35 + 1;
                uVar17 = uVar17 - 1;
                uVar13 = uVar58;
              } while (uVar17 != 0);
            }
LAB_00119caf:
            sVar55 = (size_t)*(int *)((long)num_literals + (long)psVar29 * 0x10 + 4);
            if (uVar13 < sVar55) {
              sVar55 = uVar13;
            }
            iVar26 = 0x1f;
            if (uVar50 != 0) {
              for (; uVar50 >> iVar26 == 0; iVar26 = iVar26 + -1) {
              }
            }
            local_100 = (ulong)(iVar26 * -0x1e + 0x780) + sVar55 * 0x87;
            bVar60 = true;
            bVar61 = false;
          }
        }
        else {
          bVar60 = false;
          local_108 = 0;
          sVar55 = 0;
        }
        iVar26 = 0;
        if (bVar61) goto LAB_00118aff;
      }
      else {
        uVar50 = (uint)(iVar26 * 0x1e35a7bd) >> 0x11;
        uVar17 = (ulong)uVar50;
        uVar35 = (ulong)((uint)uVar32 & 7);
        uVar16 = uVar32 & 0xfffffffffffffff8;
        local_148 = 0x7e4;
        local_118 = 0;
        lVar44 = 0;
        sVar55 = 0;
        local_108 = 0;
        local_100 = 0x7e4;
        do {
          uVar58 = (ulong)*(int *)((long)&(hasher->common).extra + lVar44 * 4);
          uVar20 = sVar28 - uVar58;
          cVar49 = (char)uVar50;
          if ((((lVar44 == 0) || (*(char *)(lVar48 + 0x30000 + (uVar20 & 0xffff)) == cVar49)) &&
              (uVar58 <= uVar39)) && (uVar20 < sVar28)) {
            if (7 < uVar32) {
              lVar46 = 0;
              uVar40 = 0;
LAB_00118754:
              if (*(ulong *)(piVar15 + uVar40 * 2) ==
                  *(ulong *)(ringbuffer + uVar40 * 8 + (uVar20 & ringbuffer_mask)))
              goto code_r0x00118766;
              uVar40 = *(ulong *)(ringbuffer + uVar40 * 8 + (uVar20 & ringbuffer_mask)) ^
                       *(ulong *)(piVar15 + uVar40 * 2);
              uVar20 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                }
              }
              uVar40 = (uVar20 >> 3 & 0x1fffffff) - lVar46;
              goto LAB_001187a1;
            }
            piVar47 = piVar15;
            uVar34 = 0;
LAB_0011882d:
            uVar40 = uVar34;
            if (uVar35 != 0) {
              uVar45 = uVar35 | uVar34;
              uVar23 = uVar35;
              do {
                uVar40 = uVar34;
                if (ringbuffer[uVar34 + (uVar20 & ringbuffer_mask)] != (uint8_t)*piVar47) break;
                piVar47 = (int *)((long)piVar47 + 1);
                uVar34 = uVar34 + 1;
                uVar23 = uVar23 - 1;
                uVar40 = uVar45;
              } while (uVar23 != 0);
            }
LAB_001187a1:
            if ((bVar60) &&
               (uVar20 = (ulong)(int)num_literals[(long)psVar29 * 2], uVar20 < uVar40 + sVar28)) {
              uVar40 = uVar20 - sVar28;
            }
            if ((1 < uVar40) && (uVar20 = uVar40 * 0x87 + 0x78f, local_148 < uVar20)) {
              if (lVar44 != 0) {
                uVar20 = uVar20 - ((0x1ca10U >> ((byte)lVar44 & 0xe) & 0xe) + 0x27);
              }
              if (local_148 < uVar20) {
                sVar55 = uVar40;
                local_100 = uVar20;
                local_148 = uVar20;
                local_118 = uVar40;
                local_108 = uVar58;
              }
            }
          }
          lVar44 = lVar44 + 1;
        } while (lVar44 != 10);
        lVar44 = *(long *)&(params->hasher).num_last_distances_to_check;
        uVar40 = sVar28 - *(uint *)(lVar48 + uVar17 * 4);
        uVar36 = *(ushort *)(lVar48 + 0x20000 + uVar17 * 2);
        uVar35 = (ulong)uVar36;
        uVar20 = (ulong)((uint)uVar32 & 7);
        uVar34 = 0;
        uVar58 = uVar40;
        do {
          bVar61 = lVar44 == 0;
          lVar44 = lVar44 + -1;
          if (bVar61) break;
          uVar34 = uVar34 + uVar58;
          uVar23 = local_100;
          uVar45 = sVar55;
          uVar31 = local_148;
          uVar56 = local_118;
          uVar59 = local_108;
          if (uVar34 <= uVar39) {
            uVar42 = (ulong)*(ushort *)(lVar48 + 0x40002 + uVar35 * 4);
            uVar58 = (ulong)*(ushort *)(lVar48 + 0x40000 + uVar35 * 4);
            uVar35 = uVar42;
            if (local_118 + uVar13 <= ringbuffer_mask) {
              uVar42 = sVar28 - uVar34 & ringbuffer_mask;
              if ((uVar42 + local_118 <= ringbuffer_mask) &&
                 (ringbuffer[local_118 + uVar13] == ringbuffer[uVar42 + local_118])) {
                if (7 < uVar32) {
                  lVar46 = 0;
                  uVar23 = 0;
LAB_00118950:
                  if (*(ulong *)(piVar15 + uVar23 * 2) ==
                      *(ulong *)(ringbuffer + uVar23 * 8 + uVar42)) goto code_r0x00118962;
                  uVar45 = *(ulong *)(ringbuffer + uVar23 * 8 + uVar42) ^
                           *(ulong *)(piVar15 + uVar23 * 2);
                  uVar23 = 0;
                  if (uVar45 != 0) {
                    for (; (uVar45 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                    }
                  }
                  uVar45 = (uVar23 >> 3 & 0x1fffffff) - lVar46;
                  goto LAB_001189aa;
                }
                piVar47 = piVar15;
                uVar31 = 0;
LAB_00118a26:
                uVar45 = uVar31;
                if (uVar20 != 0) {
                  uVar56 = uVar20 | uVar31;
                  uVar23 = uVar20;
                  do {
                    uVar45 = uVar31;
                    if (ringbuffer[uVar31 + uVar42] != (uint8_t)*piVar47) break;
                    piVar47 = (int *)((long)piVar47 + 1);
                    uVar31 = uVar31 + 1;
                    uVar23 = uVar23 - 1;
                    uVar45 = uVar56;
                  } while (uVar23 != 0);
                }
LAB_001189aa:
                if ((bVar60) &&
                   (uVar23 = (ulong)(int)num_literals[(long)psVar29 * 2], uVar23 < uVar45 + sVar28))
                {
                  uVar45 = uVar23 - sVar28;
                }
                if (3 < uVar45) {
                  iVar26 = 0x1f;
                  if ((uint)uVar34 != 0) {
                    for (; (uint)uVar34 >> iVar26 == 0; iVar26 = iVar26 + -1) {
                    }
                  }
                  uVar23 = (ulong)(iVar26 * -0x1e + 0x780) + uVar45 * 0x87;
                  uVar31 = uVar23;
                  uVar56 = uVar45;
                  uVar59 = uVar34;
                  if (local_148 < uVar23) goto LAB_00118918;
                }
                uVar23 = local_100;
                uVar45 = sVar55;
                uVar31 = local_148;
                uVar56 = local_118;
                uVar59 = local_108;
              }
            }
          }
LAB_00118918:
          local_108 = uVar59;
          local_118 = uVar56;
          local_148 = uVar31;
          local_100 = uVar23;
          sVar55 = uVar45;
        } while (uVar34 <= uVar39);
        uVar22 = (ushort)(params->hasher).block_bits;
        *(ushort *)&(params->hasher).block_bits = uVar22 + 1;
        *(char *)(lVar48 + 0x30000 + (sVar28 & 0xffff)) = cVar49;
        if (0xfffe < uVar40) {
          uVar40 = 0xffff;
        }
        *(short *)(lVar48 + 0x40000 + (ulong)uVar22 * 4) = (short)uVar40;
        *(ushort *)(lVar48 + 0x40002 + (ulong)uVar22 * 4) = uVar36;
        *(int *)(lVar48 + uVar17 * 4) = (int)sVar28;
        *(ushort *)(lVar48 + 0x20000 + uVar17 * 2) = uVar22;
        bVar60 = false;
LAB_00118aff:
        iVar26 = 0;
        if (local_100 == 0x7e4) {
          if (back_refs_position == (size_t *)0x0) {
            lVar48 = *(long *)&(params->dist).alphabet_size_max;
            if (*(ulong *)(lVar48 + 8) >> 7 <= *(ulong *)(lVar48 + 0x10)) {
              uVar39 = (ulong)((uint)(*piVar15 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
              lVar44 = *(long *)(literal_context_lut + 0x78);
              lVar46 = *(long *)(lVar48 + 8);
              iVar26 = 0;
              lVar51 = 0;
LAB_00119a0b:
              lVar46 = lVar46 + 1;
              *(long *)(lVar48 + 8) = lVar46;
              bVar21 = *(byte *)(lVar44 + uVar39);
              uVar13 = (ulong)bVar21;
              if (uVar13 != 0) {
                bVar61 = true;
                if (uVar13 <= uVar32) {
                  uVar16 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar39 * 2);
                  lVar6 = *(long *)(literal_context_lut + 0x58);
                  pcVar24 = (char *)(uVar16 * uVar13 + *(long *)(lVar6 + 0xa8) +
                                    (ulong)*(uint *)(lVar6 + 0x20 + uVar13 * 4));
                  if (7 < bVar21) {
                    sVar57 = (size_t)(bVar21 & 0xfffffff8);
                    lVar33 = 0;
                    uVar35 = 0;
LAB_00119a77:
                    if (*(ulong *)(pcVar24 + uVar35 * 8) == *(ulong *)(piVar15 + uVar35 * 2))
                    goto code_r0x00119a89;
                    uVar17 = *(ulong *)(piVar15 + uVar35 * 2) ^ *(ulong *)(pcVar24 + uVar35 * 8);
                    uVar35 = 0;
                    if (uVar17 != 0) {
                      for (; (uVar17 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                      }
                    }
                    uVar35 = (uVar35 >> 3 & 0x1fffffff) - lVar33;
                    goto LAB_00119adf;
                  }
                  sVar57 = 0;
                  goto LAB_00119bc4;
                }
                goto LAB_00119b43;
              }
              goto LAB_00119b5d;
            }
          }
          else {
            psVar29 = *(size_t **)backward_references;
            if ((psVar29 < back_refs_position) &&
               (sVar28 == (long)(int)num_literals[(long)psVar29 * 2])) {
              uVar50 = (uint)num_literals[(long)psVar29 * 2 + 1];
              if (*(int *)((long)num_literals + (long)psVar29 * 0x10 + 0xc) < (int)uVar50) {
                uVar52 = *(uint *)((long)num_literals + (long)psVar29 * 0x10 + 4);
                uVar43 = (ulong)uVar52;
                bVar60 = true;
                if (uVar52 - 4 < 0x15 && (int)uVar50 < 0x7ffffffd) {
                  uVar53 = ~(uint)uVar39 + uVar50;
                  lVar48 = *(long *)(literal_context_lut + 0x58);
                  iVar25 = (int)uVar53 >> (*(byte *)(lVar48 + uVar43) & 0x1f);
                  if (iVar25 < *(int *)(literal_context_lut + 0x60)) {
                    uVar3 = *(uint *)(lVar48 + 0x20 + uVar43 * 4);
                    uVar4 = kBitMask[*(byte *)(lVar48 + uVar43)];
                    lVar48 = *(long *)(lVar48 + 0xa8);
                    pBVar18 = BrotliGetTransforms();
                    puVar19 = (uint8_t *)malloc(uVar43 * 10);
                    iVar25 = BrotliTransformDictionaryWord
                                       (puVar19,(uint8_t *)
                                                ((ulong)uVar3 + lVar48 +
                                                (long)(int)((uVar53 & uVar4) * uVar52)),uVar52,
                                        pBVar18,iVar25);
                    sVar57 = (size_t)iVar25;
                    iVar11 = bcmp(piVar15,puVar19,sVar57);
                    if (iVar11 == 0) {
                      iVar26 = 0x1f;
                      if (uVar50 != 0) {
                        for (; uVar50 >> iVar26 == 0; iVar26 = iVar26 + -1) {
                        }
                      }
                      local_100 = (ulong)(iVar26 * -0x1e + 0x780) + sVar57 * 0x87;
                      iVar26 = uVar52 - iVar25;
                      local_108 = (long)(int)uVar50;
                      sVar55 = sVar57;
                    }
                    bVar60 = true;
                  }
                }
              }
            }
          }
        }
      }
LAB_00118c6a:
      if (local_100 < 0x7e5) {
        local_e8 = local_e8 + 1;
        position = sVar28 + 1;
        if ((back_refs_position == (size_t *)0x0) && (local_a8 < position)) {
          if ((uint)((int)lVar37 * 4) + local_a8 < position) {
            uVar39 = sVar28 + 0x11;
            if (uVar1 - 4 <= sVar28 + 0x11) {
              uVar39 = uVar1 - 4;
            }
            if (uVar39 <= position) goto LAB_0011a084;
            lVar48 = *(long *)&params->dist;
            uVar36 = (ushort)(params->hasher).block_bits;
            do {
              uVar50 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                       0x11;
              uVar43 = (ulong)uVar50;
              uVar38 = position - *(uint *)(lVar48 + uVar43 * 4);
              *(char *)(lVar48 + 0x30000 + (position & 0xffff)) = (char)uVar50;
              if (0xfffe < uVar38) {
                uVar38 = 0xffff;
              }
              uVar22 = uVar36 + 1;
              *(short *)(lVar48 + 0x40000 + (ulong)uVar36 * 4) = (short)uVar38;
              *(undefined2 *)(lVar48 + 0x40002 + (ulong)uVar36 * 4) =
                   *(undefined2 *)(lVar48 + 0x20000 + uVar43 * 2);
              *(int *)(lVar48 + uVar43 * 4) = (int)position;
              *(ushort *)(lVar48 + 0x20000 + uVar43 * 2) = uVar36;
              local_e8 = local_e8 + 4;
              position = position + 4;
              uVar36 = uVar22;
            } while (position < uVar39);
            goto LAB_0011a071;
          }
          uVar39 = sVar28 + 9;
          if (uVar1 - 3 <= sVar28 + 9) {
            uVar39 = uVar1 - 3;
          }
          if (position < uVar39) {
            lVar48 = *(long *)&params->dist;
            uVar36 = (ushort)(params->hasher).block_bits;
            do {
              uVar50 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                       0x11;
              uVar43 = (ulong)uVar50;
              uVar38 = position - *(uint *)(lVar48 + uVar43 * 4);
              *(char *)(lVar48 + 0x30000 + (position & 0xffff)) = (char)uVar50;
              if (0xfffe < uVar38) {
                uVar38 = 0xffff;
              }
              uVar22 = uVar36 + 1;
              *(short *)(lVar48 + 0x40000 + (ulong)uVar36 * 4) = (short)uVar38;
              *(undefined2 *)(lVar48 + 0x40002 + (ulong)uVar36 * 4) =
                   *(undefined2 *)(lVar48 + 0x20000 + uVar43 * 2);
              *(int *)(lVar48 + uVar43 * 4) = (int)position;
              *(ushort *)(lVar48 + 0x20000 + uVar43 * 2) = uVar36;
              local_e8 = local_e8 + 2;
              position = position + 2;
              uVar36 = uVar22;
            } while (position < uVar39);
            goto LAB_0011a071;
          }
        }
      }
      else {
        if (!bVar60) {
          uVar39 = (lVar2 + num_bytes) - sVar28;
          iVar25 = 0;
          local_d0 = local_108;
LAB_00118def:
          uVar43 = uVar39 >> 3;
          uVar32 = uVar32 - 1;
          local_118 = sVar55 - 1;
          if (uVar32 <= sVar55 - 1) {
            local_118 = uVar32;
          }
          if (4 < *(int *)(literal_context_lut + 4)) {
            local_118 = 0;
          }
          uVar38 = sVar28 + 1;
          uVar13 = uVar27;
          if (uVar38 < uVar27) {
            uVar13 = uVar38;
          }
          uVar16 = lVar5 + sVar28 + 1;
          if (uVar27 <= uVar16) {
            uVar16 = uVar27;
          }
          uVar35 = *(ulong *)(literal_context_lut + 0x50);
          lVar48 = *(long *)&params->dist;
          uVar17 = uVar38 & ringbuffer_mask;
          iVar11 = *(int *)(ringbuffer + uVar17);
          piVar15 = (int *)(ringbuffer + uVar17);
          psVar29 = *(size_t **)backward_references;
          bVar60 = psVar29 < back_refs_position;
          if (!bVar60) {
LAB_00118f74:
            uVar50 = (uint)(iVar11 * 0x1e35a7bd) >> 0x11;
            uVar20 = (ulong)uVar50;
            uVar40 = (ulong)((uint)uVar32 & 7);
            local_148 = 0x7e4;
            lVar44 = 0;
            sVar57 = 0;
            local_130 = 0;
            uVar58 = 0x7e4;
LAB_00118fb5:
            uVar34 = (ulong)*(int *)((long)&(hasher->common).extra + lVar44 * 4);
            uVar23 = uVar38 - uVar34;
            cVar49 = (char)uVar50;
            if ((((lVar44 == 0) || (*(char *)(lVar48 + 0x30000 + (uVar23 & 0xffff)) == cVar49)) &&
                (uVar34 <= uVar13)) && (uVar23 < uVar38)) {
              uVar45 = uVar40;
              if (7 < uVar32) {
                lVar46 = 0;
                uVar31 = 0;
LAB_00119006:
                if (*(ulong *)(piVar15 + uVar31 * 2) ==
                    *(ulong *)(ringbuffer + uVar31 * 8 + (uVar23 & ringbuffer_mask)))
                goto code_r0x00119018;
                uVar45 = *(ulong *)(ringbuffer + uVar31 * 8 + (uVar23 & ringbuffer_mask)) ^
                         *(ulong *)(piVar15 + uVar31 * 2);
                uVar23 = 0;
                if (uVar45 != 0) {
                  for (; (uVar45 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                  }
                }
                uVar31 = (uVar23 >> 3 & 0x1fffffff) - lVar46;
                goto LAB_00119049;
              }
              uVar31 = 0;
              piVar47 = piVar15;
              goto joined_r0x001190da;
            }
            goto LAB_001190c1;
          }
          if ((ulong)(long)(int)num_literals[(long)psVar29 * 2] < uVar38) {
            psVar41 = num_literals + (long)psVar29 * 2 + 2;
            do {
              psVar29 = (size_t *)((long)psVar29 + 1);
              if (back_refs_position == psVar29) {
                *(size_t **)backward_references = psVar29;
                bVar60 = false;
                psVar29 = back_refs_position;
                goto LAB_00118f74;
              }
              sVar8 = *psVar41;
              psVar41 = psVar41 + 2;
            } while ((ulong)(long)(int)sVar8 < uVar38);
            *(size_t **)backward_references = psVar29;
            bVar60 = psVar29 < back_refs_position;
          }
          if ((!bVar60) || (uVar38 != (long)(int)num_literals[(long)psVar29 * 2]))
          goto LAB_00118f74;
          uVar50 = (uint)num_literals[(long)psVar29 * 2 + 1];
          local_130 = (ulong)(int)uVar50;
          uVar58 = 0x7e4;
          bVar61 = true;
          if (uVar38 - local_130 < uVar38) {
            if (*(uint *)((long)num_literals + (long)psVar29 * 0x10 + 0xc) < uVar50) {
              bVar60 = false;
              local_130 = 0;
              sVar57 = 0;
              goto LAB_0011986a;
            }
            uVar17 = uVar38 - local_130 & ringbuffer_mask;
            if (7 < uVar32) {
              lVar48 = 0;
              uVar58 = 0;
LAB_001197f3:
              if (*(ulong *)(piVar15 + uVar58 * 2) == *(ulong *)(ringbuffer + uVar58 * 8 + uVar17))
              goto code_r0x00119805;
              uVar17 = *(ulong *)(ringbuffer + uVar58 * 8 + uVar17) ^
                       *(ulong *)(piVar15 + uVar58 * 2);
              uVar43 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                }
              }
              uVar43 = (uVar43 >> 3 & 0x1fffffff) - lVar48;
              goto LAB_00119831;
            }
            uVar43 = 0;
            piVar47 = piVar15;
            goto LAB_001198cb;
          }
          bVar60 = false;
          local_130 = 0;
          sVar57 = 0;
          goto LAB_0011986a;
        }
LAB_00118ca6:
        uVar39 = lVar5 + sVar28;
        if (uVar27 <= lVar5 + sVar28) {
          uVar39 = uVar27;
        }
        if (uVar39 < local_108) {
LAB_00119d1f:
          uVar43 = local_108 + 0xf;
        }
        else {
          uVar43 = (ulong)*(int *)&(hasher->common).extra;
          uVar50 = 0;
          bVar60 = false;
          if (local_108 != uVar43) {
            uVar38 = (ulong)*(int *)((long)&(hasher->common).extra + 4);
            if (local_108 == uVar38) {
              uVar50 = 1;
            }
            else {
              uVar43 = (local_108 + 3) - uVar43;
              if (uVar43 < 7) {
                bVar21 = (byte)((int)uVar43 << 2);
                uVar50 = 0x9750468;
              }
              else {
                uVar38 = (local_108 + 3) - uVar38;
                if (6 < uVar38) {
                  if (local_108 != (long)(int)(hasher->common).dict_num_lookups) {
                    bVar60 = local_108 !=
                             (long)*(int *)((long)&(hasher->common).dict_num_lookups + 4);
                    uVar50 = 3;
                    goto LAB_00119d1b;
                  }
                  uVar50 = 2;
                  goto LAB_00119d19;
                }
                bVar21 = (byte)((int)uVar38 << 2);
                uVar50 = 0xfdb1ace;
              }
              uVar50 = uVar50 >> (bVar21 & 0x1f) & 0xf;
            }
LAB_00119d19:
            bVar60 = false;
          }
LAB_00119d1b:
          if (bVar60) goto LAB_00119d1f;
          uVar43 = (ulong)uVar50;
        }
        iVar25 = (int)local_108;
        if ((local_108 <= uVar39) && (uVar43 != 0)) {
          *(int *)((long)&(hasher->common).dict_num_lookups + 4) =
               (int)(hasher->common).dict_num_lookups;
          *(void **)((long)&(hasher->common).extra + 4) = (hasher->common).extra;
          *(int *)&(hasher->common).extra = iVar25;
          *(int *)&(hasher->common).dict_num_matches = iVar25 + -1;
          *(int *)((long)&(hasher->common).dict_num_matches + 4) = iVar25 + 1;
          (hasher->common).params.type = iVar25 + -2;
          (hasher->common).params.bucket_bits = iVar25 + 2;
          (hasher->common).params.block_bits = iVar25 + -3;
          (hasher->common).params.hash_len = iVar25 + 3;
        }
        uVar50 = (uint)local_e8;
        *(uint *)local_b0 = uVar50;
        *(uint *)((long)local_b0 + 4) = iVar26 << 0x19 | (uint)sVar55;
        uVar39 = (ulong)*(uint *)(literal_context_lut + 0x44) + 0x10;
        if (uVar43 < uVar39) {
          *(short *)((long)local_b0 + 0xe) = (short)uVar43;
          uVar52 = 0;
        }
        else {
          bVar21 = (byte)*(int *)(literal_context_lut + 0x40);
          uVar43 = ((uVar43 - *(uint *)(literal_context_lut + 0x44)) + (4L << (bVar21 & 0x3f))) -
                   0x10;
          uVar52 = 0x1f;
          if ((uint)uVar43 != 0) {
            for (; (uint)uVar43 >> uVar52 == 0; uVar52 = uVar52 - 1) {
            }
          }
          uVar52 = (uVar52 ^ 0xffffffe0) + 0x1f;
          bVar60 = (uVar43 >> ((ulong)uVar52 & 0x3f) & 1) != 0;
          iVar25 = uVar52 - *(int *)(literal_context_lut + 0x40);
          *(ushort *)((long)local_b0 + 0xe) =
               (short)((uint)bVar60 + iVar25 * 2 + 0xfffe << (bVar21 & 0x3f)) +
               (short)uVar39 + (~(ushort)(-1 << (bVar21 & 0x1f)) & (ushort)uVar43) |
               (short)iVar25 * 0x400;
          uVar52 = (uint)(uVar43 - ((ulong)bVar60 + 2 << ((byte)uVar52 & 0x3f)) >> (bVar21 & 0x3f));
        }
        *(uint *)(local_b0 + 1) = uVar52;
        if (5 < local_e8) {
          if (local_e8 < 0x82) {
            uVar50 = 0x1f;
            uVar52 = (uint)(local_e8 - 2);
            if (uVar52 != 0) {
              for (; uVar52 >> uVar50 == 0; uVar50 = uVar50 - 1) {
              }
            }
            uVar50 = (int)(local_e8 - 2 >> ((char)(uVar50 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar50 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (local_e8 < 0x842) {
            uVar52 = 0x1f;
            if (uVar50 - 0x42 != 0) {
              for (; uVar50 - 0x42 >> uVar52 == 0; uVar52 = uVar52 - 1) {
              }
            }
            uVar50 = (uVar52 ^ 0xffe0) + 0x2a;
          }
          else {
            uVar50 = 0x15;
            if (0x1841 < local_e8) {
              uVar50 = (uint)(ushort)(0x17 - (local_e8 < 0x5842));
            }
          }
        }
        uVar52 = iVar26 + (uint)sVar55;
        if (uVar52 < 10) {
          uVar53 = uVar52 - 2;
        }
        else if (uVar52 < 0x86) {
          uVar52 = uVar52 - 6;
          uVar53 = 0x1f;
          if (uVar52 != 0) {
            for (; uVar52 >> uVar53 == 0; uVar53 = uVar53 - 1) {
            }
          }
          uVar53 = (int)((ulong)(long)(int)uVar52 >> ((char)(uVar53 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar53 ^ 0xffffffe0) * 2 + 0x42;
        }
        else {
          uVar53 = 0x17;
          if (uVar52 < 0x846) {
            uVar53 = 0x1f;
            if (uVar52 - 0x46 != 0) {
              for (; uVar52 - 0x46 >> uVar53 == 0; uVar53 = uVar53 - 1) {
              }
            }
            uVar53 = (uVar53 ^ 0xffe0) + 0x2c;
          }
        }
        uVar22 = (ushort)uVar53;
        uVar36 = (uVar22 & 7) + ((ushort)uVar50 & 7) * 8;
        if ((((*(ushort *)((long)local_b0 + 0xe) & 0x3ff) == 0) && ((ushort)uVar50 < 8)) &&
           (uVar22 < 0x10)) {
          if (7 < uVar22) {
            uVar36 = uVar36 | 0x40;
          }
        }
        else {
          iVar26 = ((uVar50 & 0xffff) >> 3) * 3 + ((uVar53 & 0xffff) >> 3);
          uVar36 = uVar36 + ((ushort)(0x520d40 >> ((char)iVar26 * '\x02' & 0x1fU)) & 0xc0) +
                            (short)iVar26 * 0x40 + 0x40;
        }
        *(ushort *)((long)local_b0 + 0xc) = uVar36;
        *num_commands = *num_commands + local_e8;
        position = sVar28 + sVar55;
        uVar39 = uVar12;
        if (position < uVar12) {
          uVar39 = position;
        }
        uVar43 = sVar28 + 2;
        if (local_108 < sVar55 >> 2) {
          uVar38 = position + local_108 * -4;
          if (uVar38 < uVar43) {
            uVar38 = uVar43;
          }
          uVar43 = uVar38;
          if (uVar39 < uVar38) {
            uVar43 = uVar39;
          }
        }
        local_a8 = lVar37 + sVar55 * 2 + sVar28;
        local_b0 = local_b0 + 2;
        if (uVar43 < uVar39) {
          lVar48 = *(long *)&params->dist;
          uVar36 = (ushort)(params->hasher).block_bits;
          do {
            uVar50 = (uint)(*(int *)(ringbuffer + (uVar43 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
            uVar38 = (ulong)uVar50;
            uVar13 = uVar43 - *(uint *)(lVar48 + uVar38 * 4);
            *(char *)(lVar48 + 0x30000 + (uVar43 & 0xffff)) = (char)uVar50;
            if (0xfffe < uVar13) {
              uVar13 = 0xffff;
            }
            uVar22 = uVar36 + 1;
            *(short *)(lVar48 + 0x40000 + (ulong)uVar36 * 4) = (short)uVar13;
            *(undefined2 *)(lVar48 + 0x40002 + (ulong)uVar36 * 4) =
                 *(undefined2 *)(lVar48 + 0x20000 + uVar38 * 2);
            *(int *)(lVar48 + uVar38 * 4) = (int)uVar43;
            *(ushort *)(lVar48 + 0x20000 + uVar38 * 2) = uVar36;
            uVar43 = uVar43 + 1;
            uVar36 = uVar22;
          } while (uVar39 != uVar43);
          local_e8 = 0;
LAB_0011a071:
          *(ushort *)&(params->hasher).block_bits = uVar22;
        }
        else {
          local_e8 = 0;
        }
      }
LAB_0011a084:
      sVar28 = position;
    } while (position + 4 < uVar1);
  }
  else {
    local_b0 = last_insert_len;
  }
  *(ulong *)dist_cache = (local_e8 + uVar1) - position;
  *(long *)commands = *(long *)commands + ((long)local_b0 - (long)last_insert_len >> 4);
  return;
code_r0x00118766:
  uVar40 = uVar40 + 1;
  lVar46 = lVar46 + -8;
  piVar47 = (int *)(ringbuffer + uVar16 + uVar13);
  uVar34 = uVar16;
  if (uVar32 >> 3 == uVar40) goto LAB_0011882d;
  goto LAB_00118754;
code_r0x00118962:
  uVar23 = uVar23 + 1;
  lVar46 = lVar46 + -8;
  piVar47 = (int *)(ringbuffer + uVar16 + uVar13);
  uVar31 = uVar16;
  if (uVar32 >> 3 == uVar23) goto LAB_00118a26;
  goto LAB_00118950;
code_r0x00119c59:
  uVar13 = uVar13 + 1;
  lVar48 = lVar48 + -8;
  if (uVar32 >> 3 == uVar13) goto LAB_0011a12e;
  goto LAB_00119c47;
code_r0x00119a89:
  uVar35 = uVar35 + 1;
  lVar33 = lVar33 + -8;
  if (bVar21 >> 3 == uVar35) goto code_r0x00119a95;
  goto LAB_00119a77;
code_r0x00119a95:
  pcVar24 = pcVar24 + -lVar33;
LAB_00119bc4:
  uVar17 = uVar13 & 7;
  uVar35 = sVar57;
  if ((bVar21 & 7) != 0) {
    uVar58 = sVar57 | uVar17;
    do {
      uVar35 = sVar57;
      if (*(char *)((long)piVar15 + sVar57) != *pcVar24) break;
      pcVar24 = pcVar24 + 1;
      sVar57 = sVar57 + 1;
      uVar17 = uVar17 - 1;
      uVar35 = uVar58;
    } while (uVar17 != 0);
  }
LAB_00119adf:
  if (((uVar35 == 0) || (*(uint *)(literal_context_lut + 100) + uVar35 <= uVar13)) ||
     (uVar13 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                              ((char)(uVar13 - uVar35) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar13 - uVar35) * 4 << (*(byte *)(lVar6 + uVar13) & 0x3f)) + uVar16 + uVar43 + 1,
     uVar38 < uVar13)) {
    bVar61 = true;
  }
  else {
    iVar25 = 0x1f;
    if ((uint)uVar13 != 0) {
      for (; (uint)uVar13 >> iVar25 == 0; iVar25 = iVar25 + -1) {
      }
    }
    uVar16 = (uVar35 * 0x87 - (ulong)(uint)(iVar25 * 0x1e)) + 0x780;
    bVar61 = true;
    if (local_100 <= uVar16) {
      iVar26 = (uint)bVar21 - (int)uVar35;
      bVar61 = false;
      sVar55 = uVar35;
      local_108 = uVar13;
      local_100 = uVar16;
    }
  }
LAB_00119b43:
  if (!bVar61) {
    *(long *)(lVar48 + 0x10) = *(long *)(lVar48 + 0x10) + 1;
  }
LAB_00119b5d:
  uVar39 = uVar39 + 1;
  bVar61 = lVar51 != 0;
  lVar51 = lVar51 + 1;
  if (bVar61) goto LAB_00118c6a;
  goto LAB_00119a0b;
code_r0x00119018:
  uVar31 = uVar31 + 1;
  lVar46 = lVar46 + -8;
  if (uVar43 == uVar31) goto code_r0x00119029;
  goto LAB_00119006;
code_r0x00119029:
  uVar31 = -lVar46;
  piVar47 = (int *)((long)piVar15 - lVar46);
joined_r0x001190da:
  for (; (uVar45 != 0 && (ringbuffer[uVar31 + (uVar23 & ringbuffer_mask)] == (uint8_t)*piVar47));
      uVar31 = uVar31 + 1) {
    uVar45 = uVar45 - 1;
    piVar47 = (int *)((long)piVar47 + 1);
  }
LAB_00119049:
  if ((bVar60) && (uVar23 = (ulong)(int)num_literals[(long)psVar29 * 2], uVar23 < uVar31 + uVar38))
  {
    uVar31 = uVar23 - uVar38;
  }
  if ((1 < uVar31) && (uVar23 = uVar31 * 0x87 + 0x78f, local_148 < uVar23)) {
    if (lVar44 != 0) {
      uVar23 = uVar23 - ((0x1ca10U >> ((byte)lVar44 & 0xe) & 0xe) + 0x27);
    }
    if (local_148 < uVar23) {
      sVar57 = uVar31;
      uVar58 = uVar23;
      local_148 = uVar23;
      local_130 = uVar34;
      local_118 = uVar31;
    }
  }
LAB_001190c1:
  lVar44 = lVar44 + 1;
  if (lVar44 == 10) goto LAB_00119100;
  goto LAB_00118fb5;
LAB_00119100:
  lVar44 = *(long *)&(params->hasher).num_last_distances_to_check;
  uVar45 = uVar38 - *(uint *)(lVar48 + uVar20 * 4);
  uVar36 = *(ushort *)(lVar48 + 0x20000 + uVar20 * 2);
  uVar34 = (ulong)uVar36;
  uVar23 = (ulong)((uint)uVar32 & 7);
  uVar31 = 0;
  uVar40 = uVar45;
LAB_00119145:
  bVar61 = lVar44 != 0;
  lVar44 = lVar44 + -1;
  if (bVar61) {
    uVar31 = uVar31 + uVar40;
    uVar56 = sVar57;
    uVar59 = uVar58;
    uVar42 = local_148;
    uVar9 = local_130;
    uVar10 = local_118;
    if (uVar31 <= uVar13) {
      uVar56 = (ulong)*(ushort *)(lVar48 + 0x40002 + uVar34 * 4);
      uVar40 = (ulong)*(ushort *)(lVar48 + 0x40000 + uVar34 * 4);
      uVar34 = uVar56;
      if (uVar17 + local_118 <= ringbuffer_mask) {
        uVar59 = uVar38 - uVar31 & ringbuffer_mask;
        if ((ringbuffer_mask < local_118 + uVar59) ||
           (ringbuffer[uVar17 + local_118] != ringbuffer[local_118 + uVar59])) goto LAB_00119280;
        uVar42 = uVar23;
        if (7 < uVar32) {
          local_c8 = 0;
          uVar56 = 0;
LAB_001191db:
          if (*(ulong *)(piVar15 + uVar56 * 2) == *(ulong *)(ringbuffer + uVar56 * 8 + uVar59))
          goto code_r0x001191ed;
          uVar59 = *(ulong *)(ringbuffer + uVar56 * 8 + uVar59) ^ *(ulong *)(piVar15 + uVar56 * 2);
          uVar56 = 0;
          if (uVar59 != 0) {
            for (; (uVar59 >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
            }
          }
          uVar56 = (uVar56 >> 3 & 0x1fffffff) - local_c8;
          goto LAB_0011922e;
        }
        uVar56 = 0;
        piVar47 = piVar15;
        goto joined_r0x001192ad;
      }
      goto LAB_00119280;
    }
    goto LAB_00119286;
  }
  goto LAB_001192fe;
code_r0x001191ed:
  uVar56 = uVar56 + 1;
  local_c8 = local_c8 + -8;
  if (uVar43 == uVar56) goto code_r0x00119203;
  goto LAB_001191db;
code_r0x00119203:
  uVar56 = -local_c8;
  piVar47 = (int *)((long)piVar15 - local_c8);
joined_r0x001192ad:
  for (; (uVar42 != 0 && (ringbuffer[uVar56 + uVar59] == (uint8_t)*piVar47)); uVar56 = uVar56 + 1) {
    uVar42 = uVar42 - 1;
    piVar47 = (int *)((long)piVar47 + 1);
  }
LAB_0011922e:
  if ((bVar60) && (uVar59 = (ulong)(int)num_literals[(long)psVar29 * 2], uVar59 < uVar56 + uVar38))
  {
    uVar56 = uVar59 - uVar38;
  }
  if (3 < uVar56) {
    iVar11 = 0x1f;
    if ((uint)uVar31 != 0) {
      for (; (uint)uVar31 >> iVar11 == 0; iVar11 = iVar11 + -1) {
      }
    }
    uVar59 = (ulong)(iVar11 * -0x1e + 0x780) + uVar56 * 0x87;
    uVar42 = uVar59;
    uVar9 = uVar31;
    uVar10 = uVar56;
    if (local_148 < uVar59) goto LAB_00119286;
  }
LAB_00119280:
  uVar56 = sVar57;
  uVar59 = uVar58;
  uVar42 = local_148;
  uVar9 = local_130;
  uVar10 = local_118;
LAB_00119286:
  local_118 = uVar10;
  local_130 = uVar9;
  local_148 = uVar42;
  uVar58 = uVar59;
  sVar57 = uVar56;
  if (uVar13 < uVar31) goto LAB_001192fe;
  goto LAB_00119145;
LAB_001192fe:
  uVar22 = (ushort)(params->hasher).block_bits;
  *(ushort *)&(params->hasher).block_bits = uVar22 + 1;
  *(char *)(lVar48 + 0x30000 + (uVar38 & 0xffff)) = cVar49;
  if (0xfffe < uVar45) {
    uVar45 = 0xffff;
  }
  *(short *)(lVar48 + 0x40000 + (ulong)uVar22 * 4) = (short)uVar45;
  *(ushort *)(lVar48 + 0x40002 + (ulong)uVar22 * 4) = uVar36;
  *(int *)(lVar48 + uVar20 * 4) = (int)uVar38;
  *(ushort *)(lVar48 + 0x20000 + uVar20 * 2) = uVar22;
  bVar60 = false;
  goto LAB_00119373;
code_r0x00119805:
  uVar58 = uVar58 + 1;
  lVar48 = lVar48 + -8;
  if (uVar43 == uVar58) goto code_r0x00119811;
  goto LAB_001197f3;
code_r0x00119811:
  uVar43 = -lVar48;
  piVar47 = (int *)((long)piVar15 - lVar48);
LAB_001198cb:
  uVar58 = uVar32 & 7;
  for (; (uVar58 != 0 && (ringbuffer[uVar43 + uVar17] == (uint8_t)*piVar47)); uVar43 = uVar43 + 1) {
    piVar47 = (int *)((long)piVar47 + 1);
    uVar58 = uVar58 - 1;
  }
LAB_00119831:
  sVar57 = (size_t)*(int *)((long)num_literals + (long)psVar29 * 0x10 + 4);
  if (uVar43 < sVar57) {
    sVar57 = uVar43;
  }
  iVar11 = 0x1f;
  if (uVar50 != 0) {
    for (; uVar50 >> iVar11 == 0; iVar11 = iVar11 + -1) {
    }
  }
  uVar58 = (ulong)(iVar11 * -0x1e + 0x780) + sVar57 * 0x87;
  bVar60 = true;
  bVar61 = false;
LAB_0011986a:
  iVar11 = 0;
  if (!bVar61) goto LAB_001194d7;
LAB_00119373:
  iVar11 = 0;
  if (uVar58 == 0x7e4) {
    if (back_refs_position == (size_t *)0x0) {
      lVar48 = *(long *)&(params->dist).alphabet_size_max;
      if (*(ulong *)(lVar48 + 8) >> 7 <= *(ulong *)(lVar48 + 0x10)) {
        uVar43 = (ulong)((uint)(*piVar15 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
        lVar44 = *(long *)(literal_context_lut + 0x78);
        lVar46 = *(long *)(lVar48 + 8);
        iVar11 = 0;
        lVar51 = 0;
LAB_001195e1:
        lVar46 = lVar46 + 1;
        *(long *)(lVar48 + 8) = lVar46;
        bVar21 = *(byte *)(lVar44 + uVar43);
        uVar13 = (ulong)bVar21;
        if (uVar13 != 0) {
          bVar61 = true;
          if (uVar13 <= uVar32) {
            uVar17 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar43 * 2);
            lVar6 = *(long *)(literal_context_lut + 0x58);
            pcVar24 = (char *)(uVar17 * uVar13 + *(long *)(lVar6 + 0xa8) +
                              (ulong)*(uint *)(lVar6 + 0x20 + uVar13 * 4));
            if (7 < bVar21) {
              sVar30 = (size_t)(bVar21 & 0xfffffff8);
              lVar33 = 0;
              uVar20 = 0;
LAB_0011966a:
              if (*(ulong *)(pcVar24 + uVar20 * 8) == *(ulong *)(piVar15 + uVar20 * 2))
              goto code_r0x0011967c;
              uVar40 = *(ulong *)(piVar15 + uVar20 * 2) ^ *(ulong *)(pcVar24 + uVar20 * 8);
              uVar20 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                }
              }
              uVar20 = (uVar20 >> 3 & 0x1fffffff) - lVar33;
              goto LAB_001196b6;
            }
            sVar30 = 0;
            goto LAB_00119768;
          }
          goto LAB_001195f9;
        }
        goto LAB_0011960e;
      }
    }
    else {
      psVar29 = *(size_t **)backward_references;
      if ((psVar29 < back_refs_position) && (uVar38 == (long)(int)num_literals[(long)psVar29 * 2]))
      {
        uVar50 = (uint)num_literals[(long)psVar29 * 2 + 1];
        uVar43 = (ulong)(int)uVar50;
        if (*(int *)((long)num_literals + (long)psVar29 * 0x10 + 0xc) < (int)uVar50) {
          uVar52 = *(uint *)((long)num_literals + (long)psVar29 * 0x10 + 4);
          uVar16 = (ulong)uVar52;
          bVar60 = true;
          if (uVar52 - 4 < 0x15 && (int)uVar50 < 0x7ffffffd) {
            uVar53 = ~(uint)uVar13 + uVar50;
            lVar48 = *(long *)(literal_context_lut + 0x58);
            iVar54 = (int)uVar53 >> (*(byte *)(lVar48 + uVar16) & 0x1f);
            if (iVar54 < *(int *)(literal_context_lut + 0x60)) {
              uVar3 = *(uint *)(lVar48 + 0x20 + uVar16 * 4);
              uVar4 = kBitMask[*(byte *)(lVar48 + uVar16)];
              lVar48 = *(long *)(lVar48 + 0xa8);
              pBVar18 = BrotliGetTransforms();
              puVar19 = (uint8_t *)malloc(uVar16 * 10);
              iVar11 = BrotliTransformDictionaryWord
                                 (puVar19,(uint8_t *)
                                          ((ulong)uVar3 + lVar48 +
                                          (long)(int)((uVar53 & uVar4) * uVar52)),uVar52,pBVar18,
                                  iVar54);
              sVar30 = (size_t)iVar11;
              iVar54 = bcmp(piVar15,puVar19,sVar30);
              if (iVar54 == 0) {
                iVar54 = 0x1f;
                if (uVar50 != 0) {
                  for (; uVar50 >> iVar54 == 0; iVar54 = iVar54 + -1) {
                  }
                }
                uVar58 = (ulong)(iVar54 * -0x1e + 0x780) + sVar30 * 0x87;
                iVar11 = uVar52 - iVar11;
              }
              else {
                iVar11 = 0;
                uVar43 = local_130;
                sVar30 = sVar57;
              }
              bVar60 = true;
              local_130 = uVar43;
              sVar57 = sVar30;
            }
          }
        }
      }
    }
  }
LAB_001194d7:
  bVar61 = true;
  if ((bVar60) || (local_108 = local_d0, uVar43 = sVar28, local_100 + 0xaf <= uVar58)) {
    local_e8 = local_e8 + 1;
    iVar26 = iVar25 + 1;
    bVar7 = iVar25 < 3;
    local_108 = local_130;
    sVar55 = sVar57;
    uVar43 = uVar38;
    local_100 = uVar58;
    iVar25 = iVar26;
    iVar26 = iVar11;
    if (bVar7 && !bVar60) {
      bVar61 = uVar1 <= sVar28 + 5;
    }
  }
  sVar28 = uVar43;
  uVar39 = uVar39 - 1;
  local_d0 = local_108;
  if (bVar61) goto LAB_00118ca6;
  goto LAB_00118def;
code_r0x0011967c:
  uVar20 = uVar20 + 1;
  lVar33 = lVar33 + -8;
  if (bVar21 >> 3 == uVar20) goto code_r0x00119688;
  goto LAB_0011966a;
code_r0x00119688:
  pcVar24 = pcVar24 + -lVar33;
LAB_00119768:
  uVar40 = uVar13 & 7;
  uVar20 = sVar30;
  if ((bVar21 & 7) != 0) {
    uVar34 = sVar30 | uVar40;
    do {
      uVar20 = sVar30;
      if (*(char *)((long)piVar15 + sVar30) != *pcVar24) break;
      pcVar24 = pcVar24 + 1;
      sVar30 = sVar30 + 1;
      uVar40 = uVar40 - 1;
      uVar20 = uVar34;
    } while (uVar40 != 0);
  }
LAB_001196b6:
  bVar61 = true;
  if (((uVar20 != 0) && (uVar13 < *(uint *)(literal_context_lut + 100) + uVar20)) &&
     (uVar13 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                              ((char)(uVar13 - uVar20) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar13 - uVar20) * 4 << (*(byte *)(lVar6 + uVar13) & 0x3f)) + uVar17 + uVar16 + 1,
     uVar13 <= uVar35)) {
    iVar54 = 0x1f;
    if ((uint)uVar13 != 0) {
      for (; (uint)uVar13 >> iVar54 == 0; iVar54 = iVar54 + -1) {
      }
    }
    uVar17 = (uVar20 * 0x87 - (ulong)(uint)(iVar54 * 0x1e)) + 0x780;
    if (uVar58 <= uVar17) {
      iVar11 = (uint)bVar21 - (int)uVar20;
      bVar61 = false;
      sVar57 = uVar20;
      uVar58 = uVar17;
      local_130 = uVar13;
    }
  }
LAB_001195f9:
  if (!bVar61) {
    *(long *)(lVar48 + 0x10) = *(long *)(lVar48 + 0x10) + 1;
  }
LAB_0011960e:
  uVar43 = uVar43 + 1;
  bVar61 = lVar51 != 0;
  lVar51 = lVar51 + 1;
  if (bVar61) goto LAB_001194d7;
  goto LAB_001195e1;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}